

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_quads.cpp
# Opt level: O3

void Rotate(vec2 *pCenter,vec2 *pPoint,float Rotation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = (pPoint->field_0).x - (pCenter->field_0).x;
  fVar3 = (pPoint->field_1).y - (pCenter->field_1).y;
  fVar1 = cosf(Rotation);
  fVar2 = sinf(Rotation);
  (pPoint->field_0).x = (fVar1 * fVar4 - fVar2 * fVar3) + (pCenter->field_0).x;
  fVar1 = sinf(Rotation);
  fVar2 = cosf(Rotation);
  (pPoint->field_1).y = fVar1 * fVar4 + fVar2 * fVar3 + (pCenter->field_1).y;
  return;
}

Assistant:

void Rotate(vec2 *pCenter, vec2 *pPoint, float Rotation)
{
	float x = pPoint->x - pCenter->x;
	float y = pPoint->y - pCenter->y;
	pPoint->x = x * cosf(Rotation) - y * sinf(Rotation) + pCenter->x;
	pPoint->y = x * sinf(Rotation) + y * cosf(Rotation) + pCenter->y;
}